

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O0

bool_t CheckMandatory(ebml_master *Element,bool_t bWithDefault,int ForProfile)

{
  ebml_element *peVar1;
  ebml_semantic *local_30;
  ebml_semantic *i;
  int ForProfile_local;
  bool_t bWithDefault_local;
  ebml_master *Element_local;
  
  local_30 = ((Element->Base).Context)->Semantic;
  while( true ) {
    if (local_30->eClass == (ebml_context *)0x0) {
      return 1;
    }
    if ((((local_30->Mandatory != 0) && ((local_30->DisabledProfile & ForProfile) == 0)) &&
        ((bWithDefault != 0 || (local_30->eClass->HasDefault == 0)))) &&
       (peVar1 = EBML_MasterFindFirstElt(Element,local_30->eClass,0,0,0),
       peVar1 == (ebml_element *)0x0)) break;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

static bool_t CheckMandatory(const ebml_master *Element, bool_t bWithDefault, int ForProfile)
{
    const ebml_semantic *i;
    for (i=Element->Base.Context->Semantic;i->eClass;++i)
    {
        if (i->Mandatory && (i->DisabledProfile & ForProfile) == 0 &&
            (bWithDefault || !i->eClass->HasDefault) &&
            !EBML_MasterFindChild(Element,i->eClass))
            return 0;
    }
    return 1;
}